

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O2

int pztopology::Pr<pztopology::Pr<pztopology::TPZPoint>_>::SideNodeLocId(int side,int node)

{
  int iVar1;
  ostream *poVar2;
  int ftns;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar3 = side % 3;
  uVar5 = side;
  if (side + 2U < 5) {
LAB_00deed45:
    iVar1 = Pr<pztopology::TPZPoint>::SideNodeLocId(uVar5,node);
    return iVar1;
  }
  uVar5 = side - 3U;
  if (2 < side - 3U) {
    iVar4 = (1 < (int)uVar3) + 1;
    iVar1 = node / iVar4;
    if (iVar1 != 1) {
      uVar5 = uVar3;
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Pr<TFather>::SideNodeLocId inconsistent side or node ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,side);
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,node);
        std::endl<char,std::char_traits<char>>(poVar2);
        return -1;
      }
      goto LAB_00deed45;
    }
    node = node - iVar4;
    uVar5 = uVar3;
  }
  iVar1 = Pr<pztopology::TPZPoint>::SideNodeLocId(uVar5,node);
  return iVar1 + 2;
}

Assistant:

int Pr<TFather>::SideNodeLocId(int side, int node)
	{
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::SideNodeLocId(side,node);
		if(ftns == 1) return TFather::SideNodeLocId(side-TFather::NSides,node)+TFather::NCornerNodes;
		int fatherlevel = node/TFather::NSideNodes(fatherside);
		if(fatherlevel == 0) return TFather::SideNodeLocId(fatherside,node);
		if(fatherlevel == 1) return TFather::SideNodeLocId(fatherside,node-TFather::NSideNodes(fatherside))+TFather::NCornerNodes;//TFather::NSideNodes(fatherside);
		PZError << "Pr<TFather>::SideNodeLocId inconsistent side or node " << side
		<< ' ' << node << endl;
		return -1;
	}